

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

TokenKind slang::syntax::SyntaxFacts::getModuleEndKind(TokenKind kind)

{
  TokenKind kind_local;
  TokenKind local_2;
  
  switch(kind) {
  case InterfaceKeyword:
    local_2 = EndInterfaceKeyword;
    break;
  default:
    local_2 = Unknown;
    break;
  case MacromoduleKeyword:
    local_2 = EndModuleKeyword;
    break;
  case ModuleKeyword:
    local_2 = EndModuleKeyword;
    break;
  case PackageKeyword:
    local_2 = EndPackageKeyword;
    break;
  case ProgramKeyword:
    local_2 = EndProgramKeyword;
  }
  return local_2;
}

Assistant:

parsing::TokenKind SyntaxFacts::getModuleEndKind(TokenKind kind) {
    switch (kind) {
        case TokenKind::ModuleKeyword: return TokenKind::EndModuleKeyword;
        case TokenKind::MacromoduleKeyword: return TokenKind::EndModuleKeyword;
        case TokenKind::ProgramKeyword: return TokenKind::EndProgramKeyword;
        case TokenKind::InterfaceKeyword: return TokenKind::EndInterfaceKeyword;
        case TokenKind::PackageKeyword: return TokenKind::EndPackageKeyword;
        default: return TokenKind::Unknown;
    }
}